

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decAbc.c
# Opt level: O0

Hop_Obj_t * Dec_GraphToNetworkAig(Hop_Man_t *pMan,Dec_Graph_t *pGraph)

{
  int iVar1;
  Hop_Obj_t *pHVar2;
  Dec_Node_t *pDVar3;
  Hop_Obj_t *p1;
  int local_3c;
  int i;
  Hop_Obj_t *pAnd1;
  Hop_Obj_t *pAnd0;
  Dec_Node_t *pNode;
  Dec_Graph_t *pGraph_local;
  Hop_Man_t *pMan_local;
  
  pAnd0 = (Hop_Obj_t *)0x0;
  iVar1 = Dec_GraphIsConst(pGraph);
  if (iVar1 == 0) {
    iVar1 = Dec_GraphIsVar(pGraph);
    if (iVar1 == 0) {
      for (local_3c = pGraph->nLeaves; local_3c < pGraph->nSize; local_3c = local_3c + 1) {
        pAnd0 = (Hop_Obj_t *)Dec_GraphNode(pGraph,local_3c);
        pDVar3 = Dec_GraphNode(pGraph,(uint)(pAnd0->field_0).iData >> 1 & 0x3fffffff);
        pHVar2 = Hop_NotCond((Hop_Obj_t *)(pDVar3->field_2).pFunc,(pAnd0->field_0).iData & 1);
        pDVar3 = Dec_GraphNode(pGraph,(uint)*(Dec_Edge_t *)((long)&pAnd0->field_0 + 4) >> 1 &
                                      0x3fffffff);
        p1 = Hop_NotCond((Hop_Obj_t *)(pDVar3->field_2).pFunc,
                         (uint)*(Dec_Edge_t *)((long)&pAnd0->field_0 + 4) & 1);
        pHVar2 = Hop_And(pMan,pHVar2,p1);
        ((anon_union_8_2_00c7e208_for_Dec_Node_t__2 *)&pAnd0->field_1)->pFunc = pHVar2;
      }
      pHVar2 = (pAnd0->field_1).pNext;
      iVar1 = Dec_GraphIsComplement(pGraph);
      pMan_local = (Hop_Man_t *)Hop_NotCond(pHVar2,iVar1);
    }
    else {
      pDVar3 = Dec_GraphVar(pGraph);
      pHVar2 = (Hop_Obj_t *)(pDVar3->field_2).pFunc;
      iVar1 = Dec_GraphIsComplement(pGraph);
      pMan_local = (Hop_Man_t *)Hop_NotCond(pHVar2,iVar1);
    }
  }
  else {
    pHVar2 = Hop_ManConst1(pMan);
    iVar1 = Dec_GraphIsComplement(pGraph);
    pMan_local = (Hop_Man_t *)Hop_NotCond(pHVar2,iVar1);
  }
  return (Hop_Obj_t *)pMan_local;
}

Assistant:

Hop_Obj_t * Dec_GraphToNetworkAig( Hop_Man_t * pMan, Dec_Graph_t * pGraph )
{
    Dec_Node_t * pNode = NULL; // Suppress "might be used uninitialized"
    Hop_Obj_t * pAnd0, * pAnd1;
    int i;
    // check for constant function
    if ( Dec_GraphIsConst(pGraph) )
        return Hop_NotCond( Hop_ManConst1(pMan), Dec_GraphIsComplement(pGraph) );
    // check for a literal
    if ( Dec_GraphIsVar(pGraph) )
        return Hop_NotCond( (Hop_Obj_t *)Dec_GraphVar(pGraph)->pFunc, Dec_GraphIsComplement(pGraph) );
    // build the AIG nodes corresponding to the AND gates of the graph
    Dec_GraphForEachNode( pGraph, pNode, i )
    {
        pAnd0 = Hop_NotCond( (Hop_Obj_t *)Dec_GraphNode(pGraph, pNode->eEdge0.Node)->pFunc, pNode->eEdge0.fCompl ); 
        pAnd1 = Hop_NotCond( (Hop_Obj_t *)Dec_GraphNode(pGraph, pNode->eEdge1.Node)->pFunc, pNode->eEdge1.fCompl ); 
        pNode->pFunc = Hop_And( pMan, pAnd0, pAnd1 );
    }
    // complement the result if necessary
    return Hop_NotCond( (Hop_Obj_t *)pNode->pFunc, Dec_GraphIsComplement(pGraph) );
}